

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O2

void __thiscall
duckdb::StdOutLogStorage::WriteLogEntry
          (StdOutLogStorage *this,timestamp_t timestamp,LogLevel level,string *log_type,
          string *log_message,RegisteredLoggingContext *context)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  idx_t iVar1;
  undefined8 in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0 [32];
  string local_b0;
  string local_90;
  Value local_70;
  
  ::std::__cxx11::string::string
            (local_d0,"[LOG] %s, %s, %s, %s, %s, %s, %s, %s\n",(allocator *)&stack0xfffffffffffffe4f
            );
  Value::TIMESTAMP(&local_70,timestamp);
  Value::ToString_abi_cxx11_(&local_f0,&local_70);
  ::std::__cxx11::string::string((string *)&local_110,(string *)log_type);
  EnumUtil::ToString<duckdb::LogLevel>(&local_130,level);
  ::std::__cxx11::string::string((string *)&local_150,(string *)log_message);
  EnumUtil::ToString<duckdb::LogContextScope>(&local_90,(context->context).scope);
  if ((context->context).connection_id.index == 0xffffffffffffffff) {
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe90,"NULL",(allocator *)&stack0xfffffffffffffe4e);
  }
  else {
    iVar1 = optional_idx::GetIndex(&(context->context).connection_id);
    ::std::__cxx11::to_string((string *)&stack0xfffffffffffffe90,iVar1);
  }
  if ((context->context).transaction_id.index == 0xffffffffffffffff) {
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe70,"NULL",(allocator *)&stack0xfffffffffffffe4d);
  }
  else {
    iVar1 = optional_idx::GetIndex(&(context->context).transaction_id);
    ::std::__cxx11::to_string((string *)&stack0xfffffffffffffe70,iVar1);
  }
  if ((context->context).thread_id.index == 0xffffffffffffffff) {
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe50,"NULL",(allocator *)&stack0xfffffffffffffe4c);
  }
  else {
    iVar1 = optional_idx::GetIndex(&(context->context).thread_id);
    ::std::__cxx11::to_string((string *)&stack0xfffffffffffffe50,iVar1);
  }
  params_4._M_string_length = (size_type)&stack0xfffffffffffffe70;
  params_4._M_dataplus._M_p = &stack0xfffffffffffffe90;
  params_4.field_2._M_allocated_capacity = (size_type)&stack0xfffffffffffffe50;
  params_4.field_2._8_8_ = in_stack_fffffffffffffe48;
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_b0,(StringUtil *)local_d0,&local_f0,&local_110,&local_130,&local_150,&local_90,
             params_4,in_stack_fffffffffffffe50,in_stack_fffffffffffffe70,in_stack_fffffffffffffe90)
  ;
  ::std::operator<<((ostream *)&::std::cout,(string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::__cxx11::string::~string((string *)&local_f0);
  Value::~Value(&local_70);
  ::std::__cxx11::string::~string(local_d0);
  return;
}

Assistant:

void StdOutLogStorage::WriteLogEntry(timestamp_t timestamp, LogLevel level, const string &log_type,
                                     const string &log_message, const RegisteredLoggingContext &context) {
	std::cout << StringUtil::Format(
	    "[LOG] %s, %s, %s, %s, %s, %s, %s, %s\n", Value::TIMESTAMP(timestamp).ToString(), log_type,
	    EnumUtil::ToString(level), log_message, EnumUtil::ToString(context.context.scope),
	    context.context.connection_id.IsValid() ? to_string(context.context.connection_id.GetIndex()) : "NULL",
	    context.context.transaction_id.IsValid() ? to_string(context.context.transaction_id.GetIndex()) : "NULL",
	    context.context.thread_id.IsValid() ? to_string(context.context.thread_id.GetIndex()) : "NULL");
}